

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O3

uint8_t * __thiscall
google::protobuf::compiler::CodeGeneratorResponse::_InternalSerialize
          (CodeGeneratorResponse *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  int iVar1;
  bool bVar2;
  anon_union_56_1_493b367e_for_CodeGeneratorResponse_10 aVar3;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::compiler::CodeGeneratorResponse_File>_>
  *value;
  uint8_t *puVar4;
  ulong uVar5;
  ulong uVar6;
  int index;
  char *in_R9;
  undefined8 *puVar7;
  byte *pbVar8;
  string_view field_name;
  string_view s;
  
  aVar3 = this->field_0;
  if (((undefined1  [56])aVar3 & (undefined1  [56])0x1) != (undefined1  [56])0x0) {
    puVar7 = (undefined8 *)
             ((ulong)(this->field_0)._impl_.error_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
    field_name._M_str = in_R9;
    field_name._M_len = (size_t)"google.protobuf.compiler.CodeGeneratorResponse.error";
    internal::WireFormatLite::VerifyUtf8String
              ((WireFormatLite *)*puVar7,(char *)(ulong)*(uint *)(puVar7 + 1),1,0x34,field_name);
    s._M_str = (char *)*puVar7;
    s._M_len = puVar7[1];
    target = io::EpsCopyOutputStream::WriteStringMaybeAliased(stream,1,s,target);
  }
  if (((undefined1  [56])aVar3 & (undefined1  [56])0x2) != (undefined1  [56])0x0) {
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar6 = (this->field_0)._impl_.supported_features_;
    *target = 0x10;
    pbVar8 = target + 1;
    uVar5 = uVar6;
    if (0x7f < uVar6) {
      do {
        *pbVar8 = (byte)uVar5 | 0x80;
        uVar6 = uVar5 >> 7;
        pbVar8 = pbVar8 + 1;
        bVar2 = 0x3fff < uVar5;
        uVar5 = uVar6;
      } while (bVar2);
    }
    *pbVar8 = (byte)uVar6;
    target = pbVar8 + 1;
  }
  if (((undefined1  [56])aVar3 & (undefined1  [56])0x4) != (undefined1  [56])0x0) {
    target = internal::WireFormatLite::WriteInt32ToArrayWithField<3>
                       (stream,(this->field_0)._impl_.minimum_edition_,target);
  }
  if (((undefined1  [56])aVar3 & (undefined1  [56])0x8) != (undefined1  [56])0x0) {
    target = internal::WireFormatLite::WriteInt32ToArrayWithField<4>
                       (stream,(this->field_0)._impl_.maximum_edition_,target);
  }
  iVar1 = *(int *)((long)&this->field_0 + 0x10);
  if (iVar1 != 0) {
    index = 0;
    do {
      value = internal::RepeatedPtrFieldBase::
              Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::compiler::CodeGeneratorResponse_File>>
                        (&(this->field_0)._impl_.file_.super_RepeatedPtrFieldBase,index);
      target = internal::WireFormatLite::InternalWriteMessage
                         (0xf,(MessageLite *)value,(value->field_0)._impl_._cached_size_.atom_,
                          target,stream);
      index = index + 1;
    } while (iVar1 != index);
  }
  uVar6 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar6 & 1) != 0) {
    puVar4 = internal::WireFormat::InternalSerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((uVar6 & 0xfffffffffffffffe) + 8),target,stream);
    return puVar4;
  }
  return target;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL CodeGeneratorResponse::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const CodeGeneratorResponse& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.compiler.CodeGeneratorResponse)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // optional string error = 1;
  if ((cached_has_bits & 0x00000001u) != 0) {
    const ::std::string& _s = this_._internal_error();
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(_s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "google.protobuf.compiler.CodeGeneratorResponse.error");
    target = stream->WriteStringMaybeAliased(1, _s, target);
  }

  // optional uint64 supported_features = 2;
  if ((cached_has_bits & 0x00000002u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteUInt64ToArray(
        2, this_._internal_supported_features(), target);
  }

  // optional int32 minimum_edition = 3;
  if ((cached_has_bits & 0x00000004u) != 0) {
    target =
        ::google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<3>(
            stream, this_._internal_minimum_edition(), target);
  }

  // optional int32 maximum_edition = 4;
  if ((cached_has_bits & 0x00000008u) != 0) {
    target =
        ::google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<4>(
            stream, this_._internal_maximum_edition(), target);
  }

  // repeated .google.protobuf.compiler.CodeGeneratorResponse.File file = 15;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_file_size());
       i < n; i++) {
    const auto& repfield = this_._internal_file().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            15, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.compiler.CodeGeneratorResponse)
  return target;
}